

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lemon.c
# Opt level: O1

state ** State_arrayof(void)

{
  s_x3node *psVar1;
  s_x3 *psVar2;
  state **ppsVar3;
  long lVar4;
  size_t __nmemb;
  
  psVar2 = x3a;
  if (x3a == (s_x3 *)0x0) {
    ppsVar3 = (state **)0x0;
  }
  else {
    __nmemb = (size_t)x3a->count;
    ppsVar3 = (state **)calloc(__nmemb,8);
    if (ppsVar3 != (state **)0x0 && 0 < (long)__nmemb) {
      psVar1 = psVar2->tbl;
      lVar4 = 0;
      do {
        *(undefined8 *)((long)ppsVar3 + lVar4) = *(undefined8 *)((long)&psVar1->data + lVar4 * 4);
        lVar4 = lVar4 + 8;
      } while (__nmemb * 8 != lVar4);
    }
  }
  return ppsVar3;
}

Assistant:

struct state **State_arrayof()
{
  struct state **array;
  int i,size;
  if( x3a==0 ) return 0;
  size = x3a->count;
  array = (struct state **)calloc(size, sizeof(struct state *));
  if( array ){
    for(i=0; i<size; i++) array[i] = x3a->tbl[i].data;
  }
  return array;
}